

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wang_index_impl.h
# Opt level: O0

double __thiscall
json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::jedi
          (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *this
          ,TreeIndexJSON *t1,TreeIndexJSON *t2)

{
  double dVar1;
  int iVar2;
  UnitCostModelJSON<label::JSONLabel> *pUVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  const_reference pvVar7;
  size_type sVar8;
  const_reference this_00;
  double *pdVar9;
  PostLToHeight *this_01;
  PostLToFavChild *pPVar10;
  size_t sVar11;
  PostLToChildren *pPVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  double local_3a0;
  double local_398;
  double local_390;
  double local_358;
  double local_350;
  double local_348;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  uint local_210;
  uint local_20c;
  uint t_5;
  uint t_4;
  int old_val;
  int fav_child_postid;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  uint local_1d0;
  uint local_1cc;
  uint t_3;
  uint t_2;
  double local_1c0;
  uint local_1b8;
  value_type local_1b4;
  uint t_1;
  int p_i;
  double local_1a8;
  uint local_1a0;
  int local_19c;
  uint t;
  int j_1;
  int x;
  int i;
  double min_tree_ren;
  double min_for_ren;
  double min_tree_del;
  double min_for_del;
  double min_tree_ins;
  double min_for_ins;
  uint k_1;
  int j;
  uint k;
  int i_1;
  Matrix<double> local_128;
  Matrix<double> local_100;
  Matrix<double> local_d8;
  Matrix<double> local_b0;
  Matrix<double> local_88;
  Matrix<double> local_60;
  value_type local_34;
  int local_30;
  int t1_height;
  int t2_input_size;
  int t1_input_size;
  TreeIndexJSON *t2_local;
  TreeIndexJSON *t1_local;
  WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *this_local;
  
  (this->super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>).
  subproblem_counter_ = 0;
  t1_height = (t1->super_Constants).tree_size_;
  local_30 = (t2->super_Constants).tree_size_;
  if (t1_height < 1) {
    this_local = (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                  *)(double)local_30;
  }
  else if (local_30 < 1) {
    this_local = (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                  *)(double)t1_height;
  }
  else {
    _t2_input_size = t2;
    t2_local = t1;
    t1_local = (TreeIndexJSON *)this;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PostLToHeight).postl_to_height_,(long)(t1_height + -1));
    local_34 = *pvVar4;
    std::vector<double,_std::allocator<double>_>::resize
              (&this->del_t1_subtree_,(long)(t1_height + 1));
    std::vector<double,_std::allocator<double>_>::resize
              (&this->del_f1_subtree_,(long)(t1_height + 1));
    std::vector<double,_std::allocator<double>_>::resize
              (&this->ins_t2_subtree_,(long)(local_30 + 1));
    std::vector<double,_std::allocator<double>_>::resize
              (&this->ins_f2_subtree_,(long)(local_30 + 1));
    data_structures::Matrix<double>::Matrix(&local_60,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->dt_,&local_60);
    data_structures::Matrix<double>::~Matrix(&local_60);
    data_structures::Matrix<double>::Matrix(&local_88,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->df_,&local_88);
    data_structures::Matrix<double>::~Matrix(&local_88);
    data_structures::Matrix<double>::Matrix(&local_b0,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->e0_,&local_b0);
    data_structures::Matrix<double>::~Matrix(&local_b0);
    data_structures::Matrix<double>::Matrix(&local_d8,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->e_,&local_d8);
    data_structures::Matrix<double>::~Matrix(&local_d8);
    data_structures::Matrix<double>::Matrix(&local_100,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->del_forest_,&local_100);
    data_structures::Matrix<double>::~Matrix(&local_100);
    data_structures::Matrix<double>::Matrix(&local_128,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->del_tree_,&local_128);
    data_structures::Matrix<double>::~Matrix(&local_128);
    data_structures::Matrix<double>::Matrix
              ((Matrix<double> *)&k,(long)(local_34 + 1),(long)(local_30 + 1));
    data_structures::Matrix<double>::operator=(&this->fav_child_dt_,(Matrix<double> *)&k);
    data_structures::Matrix<double>::~Matrix((Matrix<double> *)&k);
    dVar14 = std::numeric_limits<double>::infinity();
    data_structures::Matrix<double>::fill_with(&this->dt_,dVar14);
    dVar14 = std::numeric_limits<double>::infinity();
    data_structures::Matrix<double>::fill_with(&this->df_,dVar14);
    data_structures::Matrix<double>::fill_with(&this->e0_,0.0);
    data_structures::Matrix<double>::fill_with(&this->e_,0.0);
    dVar14 = std::numeric_limits<double>::infinity();
    data_structures::Matrix<double>::fill_with(&this->del_forest_,dVar14);
    dVar14 = std::numeric_limits<double>::infinity();
    data_structures::Matrix<double>::fill_with(&this->del_tree_,dVar14);
    dVar14 = std::numeric_limits<double>::infinity();
    data_structures::Matrix<double>::fill_with(&this->fav_child_dt_,dVar14);
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_t1_subtree_,0);
    *pvVar5 = 0.0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_f1_subtree_,0);
    *pvVar5 = 0.0;
    for (j = 1; j <= t1_height; j = j + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_f1_subtree_,(long)j);
      *pvVar5 = 0.0;
      k_1 = 1;
      while( true ) {
        uVar6 = (ulong)k_1;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j + -1));
        sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
        if (sVar8 < uVar6) break;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j + -1));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)(k_1 - 1));
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           (&this->del_t1_subtree_,(long)(*pvVar4 + 1));
        dVar14 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_f1_subtree_,(long)j);
        *pvVar5 = dVar14 + *pvVar5;
        k_1 = k_1 + 1;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_f1_subtree_,(long)j);
      dVar14 = *pvVar5;
      pUVar3 = (this->
               super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
               ).c_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)(j + -1));
      dVar15 = cost_model::UnitCostModelJSON<label::JSONLabel>::del(pUVar3,*pvVar4);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&this->del_t1_subtree_,(long)j);
      *pvVar5 = dVar14 + dVar15;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->ins_t2_subtree_,0);
    *pvVar5 = 0.0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->ins_f2_subtree_,0);
    *pvVar5 = 0.0;
    for (min_for_ins._4_4_ = 1; min_for_ins._4_4_ <= local_30;
        min_for_ins._4_4_ = min_for_ins._4_4_ + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&this->ins_f2_subtree_,(long)min_for_ins._4_4_);
      *pvVar5 = 0.0;
      min_for_ins._0_4_ = 1;
      while( true ) {
        uVar6 = (ulong)min_for_ins._0_4_;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                              (long)(min_for_ins._4_4_ + -1));
        sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
        if (sVar8 < uVar6) break;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                              (long)(min_for_ins._4_4_ + -1));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (pvVar7,(ulong)(min_for_ins._0_4_ - 1));
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
        dVar14 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           (&this->ins_f2_subtree_,(long)min_for_ins._4_4_);
        *pvVar5 = dVar14 + *pvVar5;
        min_for_ins._0_4_ = min_for_ins._0_4_ + 1;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&this->ins_f2_subtree_,(long)min_for_ins._4_4_);
      dVar14 = *pvVar5;
      pUVar3 = (this->
               super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
               ).c_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_t2_input_size->super_PostLToLabelId).postl_to_label_id_,
                          (long)(min_for_ins._4_4_ + -1));
      dVar15 = cost_model::UnitCostModelJSON<label::JSONLabel>::ins(pUVar3,*pvVar4);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&this->ins_t2_subtree_,(long)min_for_ins._4_4_);
      *pvVar5 = dVar14 + dVar15;
    }
    min_tree_ins = std::numeric_limits<double>::infinity();
    min_for_del = std::numeric_limits<double>::infinity();
    min_tree_del = std::numeric_limits<double>::infinity();
    min_for_ren = std::numeric_limits<double>::infinity();
    min_tree_ren = std::numeric_limits<double>::infinity();
    _x = std::numeric_limits<double>::infinity();
    j_1 = 0;
    for (t = 1; (int)t <= t1_height; t = t + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToFavorableChildOrder).postl_to_favorder_,
                          (long)(int)(t - 1));
      j_1 = *pvVar4 + 1;
      for (local_19c = 1; local_19c <= local_30; local_19c = local_19c + 1) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j_1 + -1)
                             );
        sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
        if (sVar8 == 0) {
          min_tree_del = std::numeric_limits<double>::infinity();
          min_for_ren = std::numeric_limits<double>::infinity();
        }
        else {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
          pdVar9 = data_structures::Matrix<double>::at
                             (&this->del_forest_,(long)*pvVar4,(long)(local_19c + -1));
          min_tree_del = *pdVar9;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
          pdVar9 = data_structures::Matrix<double>::at
                             (&this->del_tree_,(long)*pvVar4,(long)(local_19c + -1));
          min_for_ren = *pdVar9;
        }
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                              (long)(local_19c + -1));
        sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
        if (sVar8 == 0) {
          min_tree_ins = std::numeric_limits<double>::infinity();
          min_for_del = std::numeric_limits<double>::infinity();
        }
        else {
          min_tree_ins = std::numeric_limits<double>::infinity();
          min_for_del = std::numeric_limits<double>::infinity();
          local_1a0 = 0;
          while( true ) {
            uVar6 = (ulong)local_1a0;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
            if (sVar8 <= uVar6) break;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            iVar2 = *pvVar4;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1a0);
            pdVar9 = data_structures::Matrix<double>::at(&this->df_,(long)iVar2,(long)(*pvVar4 + 1))
            ;
            dVar14 = *pdVar9;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1a0);
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->ins_f2_subtree_,(long)(*pvVar4 + 1));
            local_1a8 = dVar14 - *pvVar5;
            pdVar9 = std::min<double>(&min_tree_ins,&local_1a8);
            min_tree_ins = *pdVar9;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            iVar2 = *pvVar4;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1a0);
            pdVar9 = data_structures::Matrix<double>::at(&this->dt_,(long)iVar2,(long)(*pvVar4 + 1))
            ;
            dVar14 = *pdVar9;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1a0);
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
            _t_1 = dVar14 - *pvVar5;
            pdVar9 = std::min<double>(&min_for_del,(double *)&t_1);
            min_for_del = *pdVar9;
            local_1a0 = local_1a0 + 1;
          }
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             (&this->ins_f2_subtree_,(long)local_19c);
          min_tree_ins = *pvVar5 + min_tree_ins;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             (&this->ins_t2_subtree_,(long)local_19c);
          min_for_del = *pvVar5 + min_for_del;
        }
        min_tree_ren = 0.0;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j_1 + -1)
                             );
        sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
        if (sVar8 == 0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             (&this->ins_f2_subtree_,(long)local_19c);
          min_tree_ren = *pvVar5 + min_tree_ren;
        }
        else {
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                (long)(local_19c + -1));
          sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
          if (sVar8 == 0) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_f1_subtree_,(long)j_1);
            min_tree_ren = *pvVar5 + min_tree_ren;
          }
          else {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            iVar2 = *pvVar4;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                  (long)(local_19c + -1));
            this_00 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                   (long)(local_19c + -1));
            sVar8 = std::vector<int,_std::allocator<int>_>::size(this_00);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,sVar8 - 1);
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)iVar2,(long)(*pvVar4 + 1));
            min_tree_ren = *pdVar9;
          }
        }
        if (min_tree_del < min_tree_ins) {
          if (min_tree_del < min_tree_ren) {
            local_358 = min_tree_del;
          }
          else {
            local_358 = min_tree_ren;
          }
          local_350 = local_358;
        }
        else {
          if (min_tree_ins < min_tree_ren) {
            local_348 = min_tree_ins;
          }
          else {
            local_348 = min_tree_ren;
          }
          local_350 = local_348;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
        pdVar9 = data_structures::Matrix<double>::at(&this->df_,(long)*pvVar4,(long)local_19c);
        *pdVar9 = local_350;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
        pdVar9 = data_structures::Matrix<double>::at(&this->df_,(long)*pvVar4,(long)local_19c);
        dVar14 = *pdVar9;
        pUVar3 = (this->
                 super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                 ).c_;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)(j_1 + -1));
        iVar2 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(_t2_input_size->super_PostLToLabelId).postl_to_label_id_,
                            (long)(local_19c + -1));
        _x = cost_model::UnitCostModelJSON<label::JSONLabel>::ren(pUVar3,iVar2,*pvVar4);
        _x = dVar14 + _x;
        if (min_for_ren < min_for_del) {
          local_3a0 = _x;
          if (min_for_ren < _x) {
            local_3a0 = min_for_ren;
          }
          local_398 = local_3a0;
        }
        else {
          local_390 = _x;
          if (min_for_del < _x) {
            local_390 = min_for_del;
          }
          local_398 = local_390;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
        pdVar9 = data_structures::Matrix<double>::at(&this->dt_,(long)*pvVar4,(long)local_19c);
        *pdVar9 = local_398;
        if (j_1 != t1_height) {
          this_01 = &t2_local->super_PostLToHeight;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this_01->postl_to_height_,(long)*pvVar4);
          local_1b4 = *pvVar4;
          pPVar10 = &t2_local->super_PostLToFavChild;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&pPVar10->postl_to_fav_child_,(long)*pvVar4);
          if (*pvVar4 == j_1 + -1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            pdVar9 = data_structures::Matrix<double>::at(&this->dt_,(long)*pvVar4,(long)local_19c);
            dVar14 = *pdVar9;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->fav_child_dt_,(long)local_1b4,(long)local_19c);
            *pdVar9 = dVar14;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_f1_subtree_,(long)(*pvVar4 + 1));
            dVar14 = *pvVar5;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            pdVar9 = data_structures::Matrix<double>::at(&this->df_,(long)*pvVar4,(long)local_19c);
            dVar15 = *pdVar9;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_f1_subtree_,(long)j_1);
            dVar1 = *pvVar5;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_forest_,(long)local_1b4,(long)(local_19c + -1));
            *pdVar9 = (dVar14 + dVar15) - dVar1;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)(*pvVar4 + 1));
            dVar14 = *pvVar5;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            pdVar9 = data_structures::Matrix<double>::at(&this->dt_,(long)*pvVar4,(long)local_19c);
            dVar15 = *pdVar9;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)j_1);
            dVar1 = *pvVar5;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_tree_,(long)local_1b4,(long)(local_19c + -1));
            *pdVar9 = (dVar14 + dVar15) - dVar1;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            *pdVar9 = 0.0;
            local_1b8 = 0;
            while( true ) {
              uVar6 = (ulong)local_1b8;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              if (sVar8 <= uVar6) break;
              if (local_1b8 == 0) {
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1b8)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                dVar15 = *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1b8)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14 + dVar15;
              }
              else {
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar7,(ulong)(local_1b8 - 1));
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1b8)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                dVar15 = *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1b8)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14 + dVar15;
              }
              local_1b8 = local_1b8 + 1;
            }
          }
          pPVar12 = &t2_local->super_PostLToChildren;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&pPVar12->postl_to_children_,(long)*pvVar4);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
          if (sVar8 == 0) {
LAB_00106537:
            pPVar10 = &t2_local->super_PostLToFavChild;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&pPVar10->postl_to_fav_child_,(long)*pvVar4);
            if (*pvVar4 != j_1 + -1) goto LAB_00106586;
          }
          else {
            pPVar12 = &t2_local->super_PostLToChildren;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&pPVar12->postl_to_children_,(long)*pvVar4);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
            if (*pvVar4 != j_1 + -1) goto LAB_00106537;
LAB_00106586:
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_forest_,(long)local_1b4,(long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_f1_subtree_,(long)(*pvVar4 + 1));
            dVar14 = *pvVar5;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            pdVar13 = data_structures::Matrix<double>::at(&this->df_,(long)*pvVar4,(long)local_19c);
            dVar15 = *pdVar13;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_f1_subtree_,(long)j_1);
            local_1c0 = (dVar14 + dVar15) - *pvVar5;
            pdVar9 = std::min<double>(pdVar9,&local_1c0);
            dVar14 = *pdVar9;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_forest_,(long)local_1b4,(long)(local_19c + -1));
            *pdVar9 = dVar14;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_tree_,(long)local_1b4,(long)(local_19c + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)(*pvVar4 + 1));
            dVar14 = *pvVar5;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToHeight).postl_to_height_,(long)(j_1 + -1));
            pdVar13 = data_structures::Matrix<double>::at(&this->dt_,(long)*pvVar4,(long)local_19c);
            dVar15 = *pdVar13;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)j_1);
            _t_3 = (dVar14 + dVar15) - *pvVar5;
            pdVar9 = std::min<double>(pdVar9,(double *)&t_3);
            dVar14 = *pdVar9;
            pdVar9 = data_structures::Matrix<double>::at
                               (&this->del_tree_,(long)local_1b4,(long)(local_19c + -1));
            *pdVar9 = dVar14;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            dVar14 = *pdVar9;
            pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
            *pdVar9 = dVar14;
            local_1cc = 0;
            while( true ) {
              uVar6 = (ulong)local_1cc;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              if (sVar8 <= uVar6) break;
              sVar11 = (size_t)local_1b4;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1cc);
              pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
              dVar14 = *pdVar9;
              sVar11 = (size_t)local_1b4;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1cc);
              pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
              *pdVar9 = dVar14;
              local_1cc = local_1cc + 1;
            }
            pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
            dVar14 = *pdVar9;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)j_1);
            dVar15 = *pvVar5;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            *pdVar9 = dVar14 + dVar15;
            local_1d0 = 0;
            while( true ) {
              uVar6 = (ulong)local_1d0;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              if (sVar8 <= uVar6) break;
              if (local_1d0 == 0) {
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                local_1d8 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->del_t1_subtree_,(long)j_1);
                local_1e0 = dVar14 + *pvVar5;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
                dVar14 = *pdVar9;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&(t2_local->super_PostLToHeight).postl_to_height_,
                                    (long)(j_1 + -1));
                iVar2 = *pvVar4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at
                                   (&this->dt_,(long)iVar2,(long)(*pvVar4 + 1));
                local_1e8 = dVar14 + *pdVar9;
                pdVar9 = std::min<double>(&local_1e0,&local_1e8);
                pdVar9 = std::min<double>(&local_1d8,pdVar9);
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14;
              }
              else {
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar7,(ulong)(local_1d0 - 1));
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                local_1f0 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->del_t1_subtree_,(long)j_1);
                local_1f8 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar7,(ulong)(local_1d0 - 1));
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&(t2_local->super_PostLToHeight).postl_to_height_,
                                    (long)(j_1 + -1));
                iVar2 = *pvVar4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at
                                   (&this->dt_,(long)iVar2,(long)(*pvVar4 + 1));
                _old_val = dVar14 + *pdVar9;
                pdVar9 = std::min<double>(&local_1f8,(double *)&old_val);
                pdVar9 = std::min<double>(&local_1f0,pdVar9);
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_1d0)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14;
              }
              local_1d0 = local_1d0 + 1;
            }
            if (local_19c != local_30) {
              pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
              dVar14 = *pdVar9;
              pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
              *pdVar9 = dVar14;
            }
          }
          pPVar10 = &t2_local->super_PostLToFavChild;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&pPVar10->postl_to_left_fav_child_,(long)*pvVar4);
          if (*pvVar4 == j_1 + -1) {
            pPVar10 = &t2_local->super_PostLToFavChild;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(j_1 + -1));
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&pPVar10->postl_to_fav_child_,(long)*pvVar4);
            t_4 = *pvVar4 + 1;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            t_5 = (uint)*pdVar9;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            dVar14 = *pdVar9;
            pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
            *pdVar9 = dVar14;
            if (local_19c != local_30) {
              pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                 (&this->del_t1_subtree_,(long)j_1);
              dVar14 = *pvVar5;
              pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
              *pdVar9 = dVar14 + *pdVar9;
            }
            local_20c = 0;
            while( true ) {
              uVar6 = (ulong)local_20c;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              if (sVar8 <= uVar6) break;
              sVar11 = (size_t)local_1b4;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_20c);
              pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
              dVar14 = *pdVar9;
              sVar11 = (size_t)local_1b4;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_20c);
              pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
              *pdVar9 = dVar14;
              local_20c = local_20c + 1;
            }
            pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
            dVar14 = *pdVar9;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               (&this->del_t1_subtree_,(long)(int)t_4);
            dVar15 = *pvVar5;
            pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
            *pdVar9 = dVar14 + dVar15;
            local_210 = 0;
            while( true ) {
              uVar6 = (ulong)local_210;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                    (long)(local_19c + -1));
              sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              if (sVar8 <= uVar6) break;
              if (local_210 == 0) {
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                local_218 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->del_t1_subtree_,(long)(int)t_4);
                local_220 = dVar14 + *pvVar5;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,(long)local_1b4,0);
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at
                                   (&this->fav_child_dt_,sVar11,(long)(*pvVar4 + 1));
                local_228 = dVar14 + *pdVar9;
                pdVar9 = std::min<double>(&local_220,&local_228);
                pdVar9 = std::min<double>(&local_218,pdVar9);
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14;
              }
              else {
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar7,(ulong)(local_210 - 1));
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->ins_t2_subtree_,(long)(*pvVar4 + 1));
                local_230 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                   (&this->del_t1_subtree_,(long)(int)t_4);
                local_238 = dVar14 + *pvVar5;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar7,(ulong)(local_210 - 1));
                pdVar9 = data_structures::Matrix<double>::at(&this->e0_,sVar11,(long)(*pvVar4 + 1));
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at
                                   (&this->fav_child_dt_,sVar11,(long)(*pvVar4 + 1));
                local_240 = dVar14 + *pdVar9;
                pdVar9 = std::min<double>(&local_238,&local_240);
                pdVar9 = std::min<double>(&local_230,pdVar9);
                dVar14 = *pdVar9;
                sVar11 = (size_t)local_1b4;
                pvVar7 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                      (long)(local_19c + -1));
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(ulong)local_210)
                ;
                pdVar9 = data_structures::Matrix<double>::at(&this->e_,sVar11,(long)(*pvVar4 + 1));
                *pdVar9 = dVar14;
              }
              local_210 = local_210 + 1;
            }
            if (local_19c != local_30) {
              dVar14 = (double)(int)t_5;
              pdVar9 = data_structures::Matrix<double>::at(&this->e_,(long)local_1b4,0);
              *pdVar9 = dVar14;
            }
          }
        }
      }
    }
    pdVar9 = data_structures::Matrix<double>::at(&this->dt_,(long)local_34,(long)local_30);
    this_local = (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                  *)*pdVar9;
  }
  return (double)this_local;
}

Assistant:

double WangTreeIndex<CostModel, TreeIndex>::jedi(const TreeIndex& t1, 
    const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  // Stop if one of the trees is empty.
  if (t1_input_size < 1) {
    return t2_input_size;
  } else if (t2_input_size < 1) {
    return t1_input_size;
  }
  int t1_height = t1.postl_to_height_[t1_input_size-1];

  // Create cost matrices.
  del_t1_subtree_.resize(t1_input_size+1);
  del_f1_subtree_.resize(t1_input_size+1);
  ins_t2_subtree_.resize(t2_input_size+1);
  ins_f2_subtree_.resize(t2_input_size+1);
  dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e0_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_forest_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_tree_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  fav_child_dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e0_.fill_with(0);
  e_.fill_with(0);
  del_forest_.fill_with(std::numeric_limits<double>::infinity());
  del_tree_.fill_with(std::numeric_limits<double>::infinity());
  fav_child_dt_.fill_with(std::numeric_limits<double>::infinity());

  // Initialize cost matrices.
  del_t1_subtree_.at(0) = 0;
  del_f1_subtree_.at(0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    del_f1_subtree_.at(i) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      del_f1_subtree_.at(i) += del_t1_subtree_.at(t1.postl_to_children_[i-1][k-1] + 1);
    }
    del_t1_subtree_.at(i) = del_f1_subtree_.at(i) + c_.del(t1.postl_to_label_id_[i - 1]);
  }

  ins_t2_subtree_[0] = 0;
  ins_f2_subtree_[0] = 0;
  for (int j = 1; j <= t2_input_size; ++j) {
    ins_f2_subtree_.at(j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      ins_f2_subtree_.at(j) += ins_t2_subtree_.at(t2.postl_to_children_[j-1][k-1] + 1);
    }
    ins_t2_subtree_.at(j) = ins_f2_subtree_.at(j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  double min_for_ins = std::numeric_limits<double>::infinity();
  double min_tree_ins = std::numeric_limits<double>::infinity();
  double min_for_del = std::numeric_limits<double>::infinity();
  double min_tree_del = std::numeric_limits<double>::infinity();
  double min_for_ren = std::numeric_limits<double>::infinity();
  double min_tree_ren = std::numeric_limits<double>::infinity();
  int i = 0;
  
  for (int x = 1; x <= t1_input_size; ++x) {
    // Get postorder number from favorable child order number.
    i = t1.postl_to_favorder_[x-1] + 1;
    // std::cout << "i: " << i << "\t";
    for (int j = 1; j <= t2_input_size; ++j) {
      // std::cout << "i: " << i << ", j: " << j << std::endl;
      // Cost for deletion.
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_del = std::numeric_limits<double>::infinity(); //ins_f2_subtree_.at(j);
        min_tree_del = std::numeric_limits<double>::infinity(); //ins_t2_subtree_.at(j);
      } else {
        // t1[i] is no leaf node. Therefore, read the previously computed value.
        min_for_del = del_forest_.at(t1.postl_to_height_[i-1], j-1);
        min_tree_del = del_tree_.at(t1.postl_to_height_[i-1], j-1);
      }

      // Cost for insertion.
      if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_ins = std::numeric_limits<double>::infinity(); //del_f1_subtree_.at(i);
        min_tree_ins = std::numeric_limits<double>::infinity(); //del_t1_subtree_.at(i);
      } else {
        // t2[j] is no leaf node. Therefore, computed the value.
        min_for_ins = std::numeric_limits<double>::infinity();
        min_tree_ins = std::numeric_limits<double>::infinity();
        for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
          min_for_ins = std::min(min_for_ins,
              (df_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_f2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
          min_tree_ins = std::min(min_tree_ins,
              (dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_t2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
        }
        min_for_ins += ins_f2_subtree_.at(j);
        min_tree_ins += ins_t2_subtree_.at(j);
      }

      // Cost for rename.
      min_for_ren = 0;
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        min_for_ren += ins_f2_subtree_.at(j);
      } else if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be deleted.
        min_for_ren += del_f1_subtree_.at(i);
      } else {
        min_for_ren = e_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t2.postl_to_children_[j-1].size()-1]+1);
      }
      // Fill forest distance matrix.
      df_.at(t1.postl_to_height_[i-1], j) = min_for_del >= min_for_ins ? min_for_ins >= min_for_ren ? min_for_ren : min_for_ins : min_for_del >= min_for_ren ? min_for_ren : min_for_del;
      // Compute tree rename based on forest cost matrix.
      min_tree_ren = df_.at(t1.postl_to_height_[i-1], j) + c_.ren(t1.postl_to_label_id_[i-1], t2.postl_to_label_id_[j-1]);

      // Fill tree distance matrix.
      dt_.at(t1.postl_to_height_[i-1], j) = min_tree_del >= min_tree_ins ? min_tree_ins >= min_tree_ren ? min_tree_ren : min_tree_ins : min_tree_del >= min_tree_ren ? min_tree_ren : min_tree_del;

      // Do not compute for the parent of the root node in T1.
      if (i != t1_input_size)
      {
        int p_i = t1.postl_to_height_[t1.postl_to_parent_[i-1]];
        // Case 1: i is favorable child of parent.
        if (t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          fav_child_dt_.at(p_i, j) = dt_.at(t1.postl_to_height_[i-1], j);
          del_forest_.at(p_i, j-1) = del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i);
          del_tree_.at  (p_i, j-1) = del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i);
          e_.at(p_i, 0) = 0;
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, 0) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            }
          }
        }
        // Case 2: i is either leftmost child (and favorable) OR not favorable child.
        if ((t1.postl_to_children_[t1.postl_to_parent_[i-1]].size() > 0 && 
            t1.postl_to_children_[t1.postl_to_parent_[i-1]][0] == i-1) ||
            t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] != i-1) {
          del_forest_.at(p_i, j-1) = std::min(del_forest_.at(p_i, j-1), del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i));
          del_tree_.at(p_i, j-1) = std::min(del_tree_.at(p_i, j-1), del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i));
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(i);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, 0)                                 + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = e0_.at(p_i, 0);
          }
        }
        // Case 3: t[i] is the left sibling of the favorable child.
        if (t1.postl_to_left_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          int fav_child_postid = t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]]+1;
          // Store initial value of first column in edit distance cost matrix.
          // It is needed for the next j. Therefore rewrite at the end.
          int old_val = e_.at(p_i, 0);
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          if (j != t2_input_size) {
            e0_.at(p_i, 0) += del_t1_subtree_.at(i);
          }
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(fav_child_postid);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, 0)                                 + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = old_val;
          }
        }
      }
    }
  }

  return dt_.at(t1_height, t2_input_size);
}